

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions.hpp
# Opt level: O3

Boxed_Value __thiscall
chaiscript::dispatch::
Proxy_Function_Callable_Impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_henson::Array_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mrzv[P]henson/src/chai/data.cpp:47:30)>
::do_call(Proxy_Function_Callable_Impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_henson::Array_&),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_mrzv[P]henson_src_chai_data_cpp:47:30)>
          *this,vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *params,
         Type_Conversions_State *t_conversions)

{
  Result_Type pAVar1;
  Type_Conversions_State *in_RCX;
  ulong uVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  Boxed_Value BVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  undefined4 local_28;
  undefined4 uStack_24;
  undefined4 uStack_20;
  undefined4 uStack_1c;
  undefined4 *local_18;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  
  pAVar1 = boxed_cast<henson::Array_const&>
                     ((Boxed_Value *)(t_conversions->m_conversions)._M_data,in_RCX);
  local_28 = (undefined4)pAVar1->count;
  uStack_24 = *(undefined4 *)((long)&pAVar1->count + 4);
  uStack_20 = (undefined4)pAVar1->stride;
  uStack_1c = *(undefined4 *)((long)&pAVar1->stride + 4);
  uVar2 = (ulong)*(index_t *)
                  ((long)&(pAVar1->address).impl_.
                          super_copy_assignment<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>,_(mpark::detail::Trait)0>
                          .
                          super_move_assignment<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>,_(mpark::detail::Trait)0>
                          .
                          super_assignment<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>_>
                          .
                          super_copy_constructor<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>,_(mpark::detail::Trait)0>
                          .
                          super_move_constructor<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>,_(mpark::detail::Trait)0>
                  + 8);
  if (uVar2 != 0xffffffff) {
    local_18 = &local_28;
    (**(code **)(mpark::detail::visitation::
                 fmatrix<mpark::detail::visitation::variant::value_visitor<chai_data(chaiscript::ChaiScript&,henson::NameMap&)::$_1::operator()(henson::Array_const&)const::extract>&&,mpark::detail::base<(mpark::detail::Trait)0,void*,float*,double*,int*,long*>const&>
                 ::value_abi_cxx11_ + uVar2 * 8))(&local_48,&local_18,pAVar1);
    BVar4 = detail::Handle_Return<std::__cxx11::string>::handle<std::__cxx11::string,void>
                      ((Handle_Return<std::__cxx11::string> *)this,&local_48);
    _Var3._M_pi = BVar4.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      _Var3._M_pi = extraout_RDX;
    }
    BVar4.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = _Var3._M_pi;
    BVar4.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)this;
    return (Boxed_Value)
           BVar4.m_data.
           super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
  }
  mpark::throw_bad_variant_access();
}

Assistant:

virtual Boxed_Value do_call(const std::vector<Boxed_Value> &params, const Type_Conversions_State &t_conversions) const CHAISCRIPT_OVERRIDE
        {
          typedef typename detail::Function_Signature<Func>::Return_Type Return_Type;
          return detail::Do_Call<Return_Type>::template go<Func>(m_f, params, t_conversions);
        }